

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

BOOL Js::JavascriptConversion::ToBoolean_Full(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  charcount_t cVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  Type *this_00;
  JavascriptTypedNumber<long> *this_01;
  long lVar7;
  JavascriptTypedNumber<unsigned_long> *this_02;
  unsigned_long uVar8;
  JavascriptString *this_03;
  JavascriptString *pstValue;
  unsigned_long value_1;
  long value;
  Type *type;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x2ec,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(aValue);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x2ed,"(VarIs<RecyclableObject>(aValue))",
                                "Should be handled already");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  this = UnsafeVarTo<Js::RecyclableObject>(aValue);
  this_00 = RecyclableObject::GetType(this);
  TVar3 = Js::Type::GetTypeId(this_00);
  switch(TVar3) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    aValue_local._4_4_ = 0;
    break;
  default:
    BVar5 = Js::JavascriptOperators::IsObject(aValue);
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x316,"(JavascriptOperators::IsObject(aValue))",
                                  "bad type object in conversion ToBoolean");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    BVar5 = Js::Type::IsFalsy(this_00);
    aValue_local._4_4_ = (uint)((BVar5 != 0 ^ 0xffU) & 1);
    break;
  case TypeIds_Int64Number:
    this_01 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    lVar7 = JavascriptTypedNumber<long>::GetValue(this_01);
    aValue_local._4_4_ = (uint)(lVar7 != 0);
    break;
  case TypeIds_LastNumberType:
    this_02 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    uVar8 = JavascriptTypedNumber<unsigned_long>::GetValue(this_02);
    aValue_local._4_4_ = (uint)(uVar8 != 0);
    break;
  case TypeIds_String:
    this_03 = UnsafeVarTo<Js::JavascriptString>(aValue);
    cVar4 = JavascriptString::GetLength(this_03);
    aValue_local._4_4_ = (uint)(cVar4 != 0);
    break;
  case TypeIds_Symbol:
    aValue_local._4_4_ = 1;
  }
  return aValue_local._4_4_;
}

Assistant:

BOOL JavascriptConversion::ToBoolean_Full(Var aValue, ScriptContext* scriptContext)
    {
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");
        AssertMsg(VarIs<RecyclableObject>(aValue), "Should be handled already");

        auto type = UnsafeVarTo<RecyclableObject>(aValue)->GetType();

        switch (type->GetTypeId())
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
            return false;

        case TypeIds_Symbol:
            return true;

#if !FLOATVAR
        case TypeIds_Number:
            {
                double value = JavascriptNumber::GetValue(aValue);
                return (!JavascriptNumber::IsNan(value)) && (!JavascriptNumber::IsZero(value));
            }
#endif

        case TypeIds_Int64Number:
            {
                __int64 value = UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue();
                return value != 0;
            }

        case TypeIds_UInt64Number:
            {
                unsigned __int64 value = UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue();
                return value != 0;
            }

        case TypeIds_String:
            {
                JavascriptString * pstValue = UnsafeVarTo<JavascriptString>(aValue);
                return pstValue->GetLength() > 0;
            }

        default:
            {
                AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToBoolean");

                // Falsy objects evaluate to false when converted to Boolean.
                return !type->IsFalsy();
            }
        }
    }